

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O0

bool __thiscall cmCTestCVS::WriteXMLUpdates(cmCTestCVS *this,cmXMLWriter *xml)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *this_00;
  char *pcVar3;
  pointer path;
  pointer ppVar4;
  string local_378 [32];
  ostringstream local_358 [8];
  ostringstream cmCTestLog_msg_1;
  iterator local_1e0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCVS::Directory>_>
  local_1d8;
  iterator local_1d0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCVS::Directory>_>
  local_1c8;
  const_iterator di;
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmXMLWriter *xml_local;
  cmCTestCVS *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  this_00 = std::operator<<((ostream *)local_190,
                            "   Gathering version information (one . per updated file):\n    ");
  std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestVC).CTest;
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCVS.cxx"
               ,0x135,pcVar3,false);
  std::__cxx11::string::~string((string *)&di);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  local_1d0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCVS::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCVS::Directory>_>_>
       ::begin(&this->Dirs);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCVS::Directory>_>
  ::_Rb_tree_const_iterator(&local_1c8,&local_1d0);
  while( true ) {
    local_1e0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCVS::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCVS::Directory>_>_>
         ::end(&this->Dirs);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCVS::Directory>_>
    ::_Rb_tree_const_iterator(&local_1d8,&local_1e0);
    bVar2 = std::operator!=(&local_1c8,&local_1d8);
    if (!bVar2) break;
    path = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCVS::Directory>_>
           ::operator->(&local_1c8);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCVS::Directory>_>
             ::operator->(&local_1c8);
    WriteXMLDirectory(this,xml,&path->first,&ppVar4->second);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCVS::Directory>_>
    ::operator++(&local_1c8);
  }
  std::__cxx11::ostringstream::ostringstream(local_358);
  std::ostream::operator<<(local_358,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestVC).CTest;
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCVS.cxx"
               ,0x13d,pcVar3,false);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::ostringstream::~ostringstream(local_358);
  return true;
}

Assistant:

bool cmCTestCVS::WriteXMLUpdates(cmXMLWriter& xml)
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Gathering version information (one . per updated file):\n"
             "    " << std::flush);

  for(std::map<std::string, Directory>::const_iterator
        di = this->Dirs.begin(); di != this->Dirs.end(); ++di)
    {
    this->WriteXMLDirectory(xml, di->first, di->second);
    }

  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl);

  return true;
}